

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnseenSlotRequestListView.cpp
# Opt level: O3

void __thiscall UnseenSlotRequestListView::display(UnseenSlotRequestListView *this)

{
  display((UnseenSlotRequestListView *)
          &this[-1].super_ListView<Slot>.super_View.menuOptions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void UnseenSlotRequestListView::display() {
    vector<Slot> temp = getQueryset();
    if (!temp.empty()) {
        cout << "Following are the unseen slot requests.\nSelect slot ID to approve/deny\n";
        for (auto &slot: temp) {
            cout << slot.getId() << ". " << slot.getRequestedBy().getFullName() << " Time: "
                 << slot.getStartTime().getTimestamp();
        }
        Slot *slot = Slot::findById(Input::getInt());
        if (slot) {
            cout << "Enter 1 to approve, 2 to deny: ";
            slot->setApproved(Input::getInt());
            slot->save();
        } else cout << "Invalid slot selection\n";
    } else cout << "No slot requests!\n";
    response->view = Controller::getInstance().getView("admin-panel");
}